

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFStream.cpp
# Opt level: O2

void __thiscall
PDFStream::PDFStream
          (PDFStream *this,bool inCompressStream,IByteWriterWithPosition *inOutputStream,
          EncryptionHelper *inEncryptionHelper,ObjectIDType inExtentObjectID,
          IObjectsContextExtender *inObjectsContextExtender)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  OutputFlateEncodeStream *pOVar4;
  OutputFlateEncodeStream *this_00;
  
  this_00 = &this->mFlateEncodingStream;
  OutputFlateEncodeStream::OutputFlateEncodeStream(this_00);
  MyStringBuf::MyStringBuf(&this->mTemporaryStream);
  OutputStringBufferStream::OutputStringBufferStream(&this->mTemporaryOutputStream);
  this->mExtender = inObjectsContextExtender;
  this->mCompressStream = inCompressStream;
  this->mExtendObjectID = inExtentObjectID;
  iVar3 = (*(inOutputStream->super_IByteWriter)._vptr_IByteWriter[3])(inOutputStream);
  this->mStreamStartPosition = CONCAT44(extraout_var,iVar3);
  this->mOutputStream = inOutputStream;
  if ((inEncryptionHelper == (EncryptionHelper *)0x0) ||
     (bVar1 = EncryptionHelper::IsEncrypting(inEncryptionHelper), !bVar1)) {
    pOVar4 = (OutputFlateEncodeStream *)0x0;
  }
  else {
    pOVar4 = (OutputFlateEncodeStream *)
             EncryptionHelper::CreateEncryptionStream(inEncryptionHelper,inOutputStream);
  }
  this->mEncryptionStream = &pOVar4->super_IByteWriterWithPosition;
  this->mStreamLength = 0;
  this->mStreamDictionaryContextForDirectExtentStream = (DictionaryContext *)0x0;
  if (this->mCompressStream == true) {
    if (this->mExtender != (IObjectsContextExtender *)0x0) {
      cVar2 = (**(code **)(*(long *)this->mExtender + 0x10))();
      if (cVar2 != '\0') {
        if (this->mEncryptionStream != (IByteWriterWithPosition *)0x0) {
          inOutputStream = this->mEncryptionStream;
        }
        inOutputStream =
             (IByteWriterWithPosition *)
             (**(code **)(*(long *)this->mExtender + 0x18))(this->mExtender,inOutputStream);
        goto LAB_001a99fc;
      }
      pOVar4 = (OutputFlateEncodeStream *)this->mEncryptionStream;
    }
    if (pOVar4 != (OutputFlateEncodeStream *)0x0) {
      inOutputStream = &pOVar4->super_IByteWriterWithPosition;
    }
    OutputFlateEncodeStream::Assign(this_00,inOutputStream,true);
    inOutputStream = &this_00->super_IByteWriterWithPosition;
  }
  else if (pOVar4 != (OutputFlateEncodeStream *)0x0) {
    inOutputStream = &pOVar4->super_IByteWriterWithPosition;
  }
LAB_001a99fc:
  this->mWriteStream = &inOutputStream->super_IByteWriter;
  return;
}

Assistant:

PDFStream::PDFStream(bool inCompressStream,
					 IByteWriterWithPosition* inOutputStream,
					 EncryptionHelper* inEncryptionHelper,
					 ObjectIDType inExtentObjectID,
					 IObjectsContextExtender* inObjectsContextExtender)
{
	mExtender = inObjectsContextExtender;
	mCompressStream = inCompressStream;
	mExtendObjectID = inExtentObjectID;	
	mStreamStartPosition = inOutputStream->GetCurrentPosition();
	mOutputStream = inOutputStream;
	if (inEncryptionHelper && inEncryptionHelper->IsEncrypting()) {
		mEncryptionStream = inEncryptionHelper->CreateEncryptionStream(inOutputStream);
	}
	else {
		mEncryptionStream = NULL;
	}

	mStreamLength = 0;
    mStreamDictionaryContextForDirectExtentStream = NULL;


	if(mCompressStream)
	{
		if(mExtender && mExtender->OverridesStreamCompression())
		{
			mWriteStream = mExtender->GetCompressionWriteStream(mEncryptionStream ? mEncryptionStream:inOutputStream);
		}
		else
		{
			mFlateEncodingStream.Assign(mEncryptionStream ? mEncryptionStream : inOutputStream);
			mWriteStream = &mFlateEncodingStream;
		}
	}
	else
		mWriteStream = mEncryptionStream ? mEncryptionStream : inOutputStream;

}